

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int send_client_hello(ptls_t *tls,ptls_message_emitter_t *emitter,
                     ptls_handshake_properties_t *properties,ptls_iovec_t *cookie)

{
  st_ptls_esni_secret_t **esni;
  ptls_key_exchange_context_t **pppVar1;
  ushort *end;
  byte bVar2;
  ushort uVar3;
  ptls_key_schedule_t *ppVar4;
  ptls_context_t *ppVar5;
  ptls_cipher_suite_t *ppVar6;
  st_ptls_update_esni_key_t *psVar7;
  size_t *psVar8;
  ptls_buffer_t *buf;
  ptls_buffer_t *buf_00;
  ptls_key_exchange_algorithm_t *ppVar9;
  st_ptls_key_exchange_algorithm_t *psVar10;
  ptls_iovec_t *ppVar11;
  ptls_hash_algorithm_t *ppVar12;
  ptls_iovec_t pVar13;
  undefined8 ctx;
  ushort uVar14;
  int iVar15;
  st_ptls_esni_secret_t *psVar16;
  ptls_cipher_suite_t **pppVar17;
  ptls_hash_context_t *ppVar18;
  uint8_t *src;
  ptls_key_schedule_t *sched;
  uint64_t uVar19;
  size_t sVar20;
  size_t sVar21;
  int iVar22;
  ptls_key_exchange_algorithm_t **pppVar23;
  size_t sVar24;
  size_t sVar25;
  long lVar26;
  uint8_t *puVar27;
  ushort *puVar28;
  ptls_early_data_acceptance_t pVar29;
  size_t bytes_to_pad;
  ulong uVar30;
  size_t delta;
  ushort *puVar31;
  ulong uVar32;
  ushort *puVar33;
  anon_union_104_1_5036e509_for_st_ptls_esni_secret_t_3 *paVar34;
  bool bVar35;
  ptls_iovec_t ikm;
  long local_158;
  size_t local_150;
  size_t local_140;
  ushort *local_138;
  ushort *local_110;
  st_ptls_esni_secret_t *local_108;
  undefined1 local_fc;
  undefined1 local_fb;
  ushort local_fa;
  ushort local_f8;
  ushort local_f6;
  undefined1 local_f4;
  ushort local_f3;
  undefined1 local_f1;
  ptls_key_exchange_algorithm_t **local_f0;
  anon_union_104_1_5036e509_for_st_ptls_esni_secret_t_3 *local_e8;
  ptls_buffer_t *local_e0;
  size_t local_d8;
  char *local_d0;
  ulong local_c8;
  uint64_t not_before;
  uint32_t max_early_data_size;
  uint32_t age_add;
  undefined1 local_ae;
  undefined1 local_ad;
  undefined1 local_ac;
  undefined1 local_ab;
  undefined2 local_aa;
  undefined2 local_a8;
  undefined2 local_a6;
  undefined2 local_a4;
  undefined2 local_a2;
  undefined2 local_a0;
  undefined2 local_9e;
  undefined2 local_9c;
  undefined2 local_9a;
  undefined2 local_98;
  undefined2 local_96;
  undefined2 local_94;
  undefined2 local_92;
  ptls_iovec_t resumption_ticket;
  uint64_t not_after;
  uint8_t binder_key [64];
  
  ppVar4 = tls->key_schedule;
  if (tls->server_name == (char *)0x0) {
    bVar35 = false;
  }
  else {
    iVar15 = ptls_server_name_is_ipaddr(tls->server_name);
    bVar35 = iVar15 == 0;
  }
  if (properties != (ptls_handshake_properties_t *)0x0) {
    if (((bool)(ppVar4 == (ptls_key_schedule_t *)0x0 & bVar35)) &&
       (puVar33 = (ushort *)(properties->field_0).client.esni_keys.base, puVar33 != (ushort *)0x0))
    {
      ppVar5 = tls->ctx;
      uVar32 = (properties->field_0).client.esni_keys.len;
      psVar16 = (st_ptls_esni_secret_t *)calloc(1,200);
      tls->esni = psVar16;
      if (psVar16 == (st_ptls_esni_secret_t *)0x0) {
        iVar15 = 0x201;
        goto LAB_0010aaea;
      }
      esni = &tls->esni;
      if (((1 < (long)uVar32) && ((ushort)(*puVar33 << 8 | *puVar33 >> 8) == 0xff01)) &&
         (5 < uVar32)) {
        local_f0 = (ptls_key_exchange_algorithm_t **)tls->client_random;
        local_e8 = &psVar16->field_3;
        local_e0 = (ptls_buffer_t *)((long)&psVar16->field_3 + 8);
        end = (ushort *)((long)puVar33 + uVar32);
        for (pppVar17 = ppVar5->cipher_suites; ppVar6 = *pppVar17,
            ppVar6 != (ptls_cipher_suite_t *)0x0; pppVar17 = pppVar17 + 1) {
          if ((ppVar6->id | 2) == 0x1303) {
            ppVar18 = (*ppVar6->hash->create)();
            if (ppVar18 != (ptls_hash_context_t *)0x0) {
              (*ppVar18->update)(ppVar18,puVar33,2);
              (*ppVar18->update)(ppVar18,"",4);
              local_c8 = uVar32 - 6;
              (*ppVar18->update)(ppVar18,puVar33 + 3);
              (*ppVar18->final)(ppVar18,binder_key,PTLS_HASH_FINAL_MODE_FREE);
              if ((*(int *)(puVar33 + 1) == binder_key._0_4_) && (1 < local_c8)) {
                uVar30 = (ulong)(ushort)(puVar33[3] << 8 | puVar33[3] >> 8);
                local_110 = puVar33 + 4;
                if (uVar30 <= uVar32 - 8) {
                  puVar28 = (ushort *)((long)local_110 + uVar30);
                  iVar15 = select_key_share((ptls_key_exchange_algorithm_t **)local_e8,
                                            &resumption_ticket,ppVar5->key_exchanges,
                                            (uint8_t **)&local_110,(uint8_t *)puVar28,0);
                  if (((iVar15 == 0) && (local_110 == puVar28)) &&
                     (1 < (ulong)((long)end - (long)puVar28))) {
                    uVar30 = (ulong)(ushort)(*local_110 << 8 | *local_110 >> 8);
                    puVar28 = local_110 + 1;
                    if (uVar30 <= (ulong)((long)end - (long)puVar28)) {
                      puVar31 = (ushort *)(uVar30 + (long)puVar28);
                      iVar15 = select_cipher((ptls_cipher_suite_t **)local_e0,ppVar5->cipher_suites,
                                             (uint8_t *)puVar28,(uint8_t *)puVar31);
                      if ((iVar15 == 0) && (1 < (long)end - (long)puVar31)) {
                        (psVar16->field_3).client.padded_length = *puVar31 << 8 | *puVar31 >> 8;
                        local_110 = puVar31 + 1;
                        iVar15 = ptls_decode64(&not_before,(uint8_t **)&local_110,(uint8_t *)end);
                        if ((iVar15 == 0) &&
                           ((iVar15 = ptls_decode64(&not_after,(uint8_t **)&local_110,(uint8_t *)end
                                                   ), iVar15 == 0 &&
                            (1 < (ulong)((long)end - (long)local_110))))) {
                          uVar30 = (ulong)(ushort)(*local_110 << 8 | *local_110 >> 8);
                          puVar28 = local_110 + 1;
                          if (uVar30 <= (ulong)((long)end - (long)puVar28)) {
                            puVar31 = (ushort *)(uVar30 + (long)puVar28);
                            goto LAB_0010ae14;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            break;
          }
        }
      }
      goto LAB_0010a7c7;
    }
    goto LAB_0010a81b;
  }
  local_138 = (ushort *)0x0;
  uVar32 = 0;
  iVar15 = 0;
  iVar22 = 0;
  if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) goto LAB_0010a92e;
LAB_0010a941:
  if (ppVar4 == (ptls_key_schedule_t *)0x0) {
    sched = key_schedule_new(tls->cipher_suite,tls->ctx->cipher_suites,
                             tls->ctx->hkdf_label_prefix__obsolete);
    tls->key_schedule = sched;
    ikm.len = uVar32;
    ikm.base = (uint8_t *)local_138;
    iVar15 = key_schedule_extract(sched,ikm);
    if (iVar15 != 0) goto LAB_0010aaea;
  }
  sVar21 = emitter->record_header_length;
  sVar24 = emitter->buf->off;
  iVar15 = (*emitter->begin_message)(emitter);
  if (iVar15 == 0) {
    buf = emitter->buf;
    local_f1 = 1;
    local_e8 = (anon_union_104_1_5036e509_for_st_ptls_esni_secret_t_3 *)(sVar21 + sVar24);
    iVar15 = ptls_buffer__do_pushv(buf,&local_f1,1);
    if ((iVar15 == 0) && (iVar15 = ptls_buffer__do_pushv(buf,"",3), iVar15 == 0)) {
      local_140 = buf->off;
      buf_00 = emitter->buf;
      local_92 = 0x303;
      iVar15 = ptls_buffer__do_pushv(buf_00,&local_92,2);
      if ((iVar15 == 0) &&
         ((iVar15 = ptls_buffer__do_pushv(buf_00,tls->client_random,0x20), iVar15 == 0 &&
          (iVar15 = ptls_buffer__do_pushv(buf_00,"",1), iVar15 == 0)))) {
        sVar21 = buf_00->off;
        iVar15 = ptls_buffer__do_pushv(buf_00,&tls->field_20,0x20);
        if (iVar15 == 0) {
          buf_00->base[sVar21 - 1] = (char)(int)buf_00->off - (char)sVar21;
          iVar15 = ptls_buffer__do_pushv(buf_00,"",2);
          if (iVar15 == 0) {
            local_f0 = (ptls_key_exchange_algorithm_t **)0x10;
            sVar21 = buf_00->off;
            pppVar17 = tls->ctx->cipher_suites;
            local_e0 = buf;
            do {
              if (*pppVar17 == (ptls_cipher_suite_t *)0x0) {
                lVar26 = buf_00->off - sVar21;
                buf_00->base[sVar21 - 2] = (uint8_t)((ulong)lVar26 >> 8);
                buf_00->base[sVar21 - 1] = (uint8_t)lVar26;
                iVar15 = ptls_buffer__do_pushv(buf_00,"",1);
                if (iVar15 != 0) break;
                sVar21 = buf_00->off;
                local_f4 = 0;
                iVar15 = ptls_buffer__do_pushv(buf_00,&local_f4,1);
                if (iVar15 != 0) break;
                buf_00->base[sVar21 - 1] = (char)(int)buf_00->off - (char)sVar21;
                iVar15 = ptls_buffer__do_pushv(buf_00,"",2);
                if (iVar15 != 0) break;
                local_c8 = buf_00->off;
                local_94 = 0x3300;
                iVar15 = ptls_buffer__do_pushv(buf_00,&local_94,2);
                if ((iVar15 != 0) || (iVar15 = ptls_buffer__do_pushv(buf_00,"",2), iVar15 != 0))
                break;
                sVar21 = buf_00->off;
                iVar15 = ptls_buffer__do_pushv(buf_00,"",2);
                if (iVar15 != 0) break;
                sVar24 = buf_00->off;
                psVar10 = tls->key_share;
                sVar20 = sVar24;
                if (psVar10 != (st_ptls_key_exchange_algorithm_t *)0x0) {
                  pppVar1 = &(tls->field_20).client.key_share_ctx;
                  iVar15 = (*psVar10->create)(psVar10,pppVar1);
                  if ((iVar15 != 0) ||
                     (iVar15 = push_key_share_entry(buf_00,tls->key_share->id,(*pppVar1)->pubkey),
                     iVar15 != 0)) break;
                  sVar20 = buf_00->off;
                }
                buf_00->base[sVar24 - 2] = (uint8_t)(sVar20 - sVar24 >> 8);
                buf_00->base[sVar24 - 1] = (uint8_t)(sVar20 - sVar24);
                sVar24 = buf_00->off - sVar21;
                buf_00->base[sVar21 - 2] = (uint8_t)(sVar24 >> 8);
                buf_00->base[sVar21 - 1] = (uint8_t)sVar24;
                if (bVar35) {
                  if (tls->esni == (st_ptls_esni_secret_t *)0x0) {
                    local_98 = 0;
                    iVar15 = ptls_buffer__do_pushv(buf_00,&local_98,2);
                    if ((iVar15 != 0) || (iVar15 = ptls_buffer__do_pushv(buf_00,"",2), iVar15 != 0))
                    break;
                    sVar20 = buf_00->off;
                    iVar15 = emit_server_name_extension(buf_00,tls->server_name);
                  }
                  else {
                    local_96 = 0xceff;
                    iVar15 = ptls_buffer__do_pushv(buf_00,&local_96,2);
                    if ((iVar15 != 0) || (iVar15 = ptls_buffer__do_pushv(buf_00,"",2), iVar15 != 0))
                    break;
                    sVar20 = buf_00->off;
                    local_d0 = tls->server_name;
                    local_108 = tls->esni;
                    binder_key[0] = '\0';
                    binder_key[1] = '\0';
                    binder_key[2] = '\0';
                    binder_key[3] = '\0';
                    binder_key[4] = '\0';
                    binder_key[5] = '\0';
                    binder_key[6] = '\0';
                    binder_key[7] = '\0';
                    iVar15 = create_esni_aead((ptls_aead_context_t **)binder_key,1,
                                              (local_108->field_3).client.cipher,local_108->secret,
                                              local_108->esni_contents_hash);
                    if (iVar15 == 0) {
                      uVar14 = ((local_108->field_3).client.cipher)->id;
                      local_110 = (ushort *)CONCAT62(local_110._2_6_,uVar14 << 8 | uVar14 >> 8);
                      iVar15 = ptls_buffer__do_pushv(buf_00,&local_110,2);
                      if (((iVar15 == 0) &&
                          (iVar15 = push_key_share_entry
                                              (buf_00,((local_108->field_3).client.key_share)->id,
                                               (local_108->field_3).client.pubkey), iVar15 == 0)) &&
                         (iVar15 = ptls_buffer__do_pushv(buf_00,"",2), iVar15 == 0)) {
                        sVar25 = buf_00->off;
                        iVar15 = ptls_buffer__do_pushv
                                           (buf_00,(void *)((long)&local_108->field_3 + 0x20),
                                            ((local_108->field_3).client.cipher)->hash->digest_size)
                        ;
                        if (iVar15 == 0) {
                          lVar26 = buf_00->off - sVar25;
                          buf_00->base[sVar25 - 2] = (uint8_t)((ulong)lVar26 >> 8);
                          buf_00->base[sVar25 - 1] = (uint8_t)lVar26;
                          iVar15 = ptls_buffer__do_pushv(buf_00,"",2);
                          if (iVar15 == 0) {
                            local_d8 = buf_00->off;
                            iVar15 = ptls_buffer__do_pushv(buf_00,local_108->nonce,0x10);
                            if ((iVar15 == 0) &&
                               (iVar15 = emit_server_name_extension(buf_00,local_d0), iVar15 == 0))
                            {
                              uVar32 = buf_00->off - local_d8;
                              uVar30 = (ulong)*(ushort *)((long)&local_108->field_3 + 0x60) + 0x10;
                              delta = uVar30 - uVar32;
                              if (uVar32 <= uVar30 && delta != 0) {
                                iVar15 = ptls_buffer_reserve(buf_00,delta);
                                if (iVar15 != 0) goto LAB_0010b1ec;
                                memset(buf_00->base + buf_00->off,0,delta);
                                buf_00->off = buf_00->off + delta;
                              }
                              ctx = binder_key._0_8_;
                              iVar15 = ptls_buffer_reserve(buf_00,*(size_t *)
                                                                   (*(long *)binder_key._0_8_ + 0x28
                                                                   ));
                              if (iVar15 == 0) {
                                puVar27 = buf_00->base + local_d8;
                                iVar15 = 0;
                                ptls_aead_encrypt((ptls_aead_context_t *)ctx,puVar27,puVar27,
                                                  buf_00->off - local_d8,0,buf_00->base + sVar21,
                                                  sVar24);
                                sVar21 = buf_00->off + *(long *)(*(long *)ctx + 0x28);
                                buf_00->off = sVar21;
                                lVar26 = sVar21 - local_d8;
                                buf_00->base[local_d8 - 2] = (uint8_t)((ulong)lVar26 >> 8);
                                buf_00->base[local_d8 - 1] = (uint8_t)lVar26;
                              }
                            }
                          }
                        }
                      }
                    }
LAB_0010b1ec:
                    if (binder_key._0_8_ != 0) {
                      ptls_aead_free((ptls_aead_context_t *)binder_key._0_8_);
                    }
                  }
                  if (iVar15 != 0) break;
                  lVar26 = buf_00->off - sVar20;
                  buf_00->base[sVar20 - 2] = (uint8_t)((ulong)lVar26 >> 8);
                  buf_00->base[sVar20 - 1] = (uint8_t)lVar26;
                }
                if ((properties == (ptls_handshake_properties_t *)0x0) ||
                   ((properties->field_0).client.negotiated_protocols.count == 0))
                goto LAB_0010b4de;
                local_9a = 0x1000;
                iVar15 = ptls_buffer__do_pushv(buf_00,&local_9a,2);
                if ((iVar15 == 0) && (iVar15 = ptls_buffer__do_pushv(buf_00,"",2), iVar15 == 0)) {
                  local_108 = (st_ptls_esni_secret_t *)buf_00->off;
                  iVar15 = ptls_buffer__do_pushv(buf_00,"",2);
                  if (iVar15 == 0) {
                    local_d0 = (char *)buf_00->off;
                    local_158 = 8;
                    local_150 = 0;
                    goto LAB_0010b42e;
                  }
                }
                break;
              }
              uVar14 = (*pppVar17)->id;
              local_f3 = uVar14 << 8 | uVar14 >> 8;
              iVar15 = ptls_buffer__do_pushv(buf_00,&local_f3,2);
              pppVar17 = pppVar17 + 1;
            } while (iVar15 == 0);
          }
        }
      }
    }
  }
LAB_0010aaea:
  (*ptls_clear_memory)(binder_key,0x40);
  return iVar15;
LAB_0010ae14:
  if (puVar28 == puVar31) goto LAB_0010b20f;
  if (((long)puVar31 - (long)puVar28 < 2) || (((long)puVar31 - (long)puVar28) - 2U < 2))
  goto LAB_0010a7c7;
  uVar30 = (ulong)(ushort)(puVar28[1] << 8 | puVar28[1] >> 8);
  if ((ulong)((long)puVar31 - (long)(puVar28 + 2)) < uVar30) goto LAB_0010a7c7;
  puVar28 = (ushort *)((long)(puVar28 + 2) + uVar30);
  goto LAB_0010ae14;
LAB_0010b20f:
  if (puVar31 == end) {
    uVar19 = (*ppVar5->get_time->cb)(ppVar5->get_time);
    if ((uVar19 / 1000 < not_before) || (not_after < uVar19 / 1000)) goto LAB_0010a7c7;
    (*ppVar5->random_bytes)((*esni)->nonce,0x10);
    iVar15 = ptls_calc_hash((((*esni)->field_3).client.cipher)->hash,
                            (void *)((long)&(*esni)->field_3 + 0x20),puVar33,uVar32);
    if (iVar15 != 0) {
LAB_0010b30b:
      free_esni_secret(esni,0);
      goto LAB_0010aaea;
    }
    psVar16 = *esni;
    psVar10 = (psVar16->field_3).client.key_share;
    pVar13.len = resumption_ticket.len;
    pVar13.base = resumption_ticket.base;
    iVar15 = (*psVar10->exchange)(psVar10,&(psVar16->field_3).client.pubkey,&psVar16->secret,pVar13)
    ;
    if (iVar15 != 0) goto LAB_0010b30b;
    psVar16 = *esni;
    iVar15 = build_esni_contents_hash
                       (((psVar16->field_3).client.cipher)->hash,psVar16->esni_contents_hash,
                        (psVar16->field_3).client.record_digest,
                        ((psVar16->field_3).client.key_share)->id,(psVar16->field_3).client.pubkey,
                        (uint8_t *)local_f0);
    if (iVar15 != 0) goto LAB_0010b30b;
  }
  else {
LAB_0010a7c7:
    free(*esni);
    *esni = (st_ptls_esni_secret_t *)0x0;
  }
  psVar7 = tls->ctx->update_esni_key;
  if (psVar7 != (st_ptls_update_esni_key_t *)0x0) {
    psVar16 = tls->esni;
    iVar15 = (*psVar7->cb)(psVar7,tls,psVar16->secret,((psVar16->field_3).client.cipher)->hash,
                           psVar16->esni_contents_hash);
    if (iVar15 != 0) goto LAB_0010aaea;
  }
LAB_0010a81b:
  puVar33 = (ushort *)(properties->field_0).client.session_ticket.base;
  pVar29 = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
  if (puVar33 == (ushort *)0x0) {
    local_138 = (ushort *)0x0;
    uVar32 = 0;
    iVar15 = 0;
  }
  else {
    puVar27 = (uint8_t *)((properties->field_0).client.session_ticket.len + (long)puVar33);
    local_110 = puVar33;
    iVar15 = ptls_decode64(&not_before,(uint8_t **)&local_110,puVar27);
    if ((((iVar15 == 0) && (1 < (long)puVar27 - (long)local_110)) &&
        (1 < ((long)puVar27 - (long)local_110) + -2)) &&
       (2 < (ulong)((long)puVar27 - (long)(local_110 + 2)))) {
      uVar14 = *local_110;
      uVar3 = local_110[1];
      lVar26 = 0;
      uVar32 = 0;
      do {
        uVar32 = (ulong)*(byte *)((long)(local_110 + 2) + lVar26) | uVar32 << 8;
        lVar26 = lVar26 + 1;
      } while (lVar26 != 3);
      src = (uint8_t *)((long)local_110 + 7);
      if (uVar32 <= (ulong)((long)puVar27 - (long)src)) {
        puVar33 = (ushort *)(src + uVar32);
        iVar15 = decode_new_session_ticket
                           (tls,(uint32_t *)&not_after,&age_add,(ptls_iovec_t *)binder_key,
                            &resumption_ticket,&max_early_data_size,src,(uint8_t *)puVar33);
        if ((1 < (ulong)((long)puVar27 - (long)puVar33)) && (iVar15 == 0)) {
          uVar32 = (ulong)(ushort)(*puVar33 << 8 | *puVar33 >> 8);
          local_138 = puVar33 + 1;
          if ((uint8_t *)((long)puVar33 + uVar32 + 2) == puVar27 &&
              uVar32 <= (ulong)((long)puVar27 - (long)local_138)) {
            ppVar5 = tls->ctx;
            pppVar23 = ppVar5->key_exchanges;
            do {
              ppVar9 = *pppVar23;
              if (ppVar9 == (ptls_key_exchange_algorithm_t *)0x0) goto LAB_0010a8c7;
              pppVar23 = pppVar23 + 1;
            } while (ppVar9->id != (uint16_t)(uVar14 << 8 | uVar14 >> 8));
            pppVar17 = ppVar5->cipher_suites;
            do {
              ppVar6 = *pppVar17;
              if (ppVar6 == (ptls_cipher_suite_t *)0x0) goto LAB_0010a8c7;
              pppVar17 = pppVar17 + 1;
            } while (ppVar6->id != (uint16_t)(uVar3 << 8 | uVar3 >> 8));
            uVar19 = (*ppVar5->get_time->cb)(ppVar5->get_time);
            if ((not_before <= uVar19) && (uVar19 - not_before < 0x240c8400)) {
              bVar2 = (tls->field_20).server.pending_traffic_secret[0x28];
              iVar15 = (int)(uVar19 - not_before) + age_add;
              (tls->field_20).server.pending_traffic_secret[0x28] = bVar2 | 1;
              if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
                tls->key_share = ppVar9;
              }
              tls->cipher_suite = ppVar6;
              if ((max_early_data_size != 0 && ppVar4 == (ptls_key_schedule_t *)0x0) &&
                 ((properties->field_0).client.max_early_data_size != (size_t *)0x0)) {
                (tls->field_20).server.pending_traffic_secret[0x28] = bVar2 | 3;
                *(properties->field_0).client.max_early_data_size = (ulong)max_early_data_size;
              }
              goto LAB_0010a8f7;
            }
          }
        }
      }
    }
LAB_0010a8c7:
    iVar15 = 0;
    local_138 = (ushort *)0x0;
    uVar32 = 0;
  }
LAB_0010a8f7:
  if (((tls->field_20).server.pending_traffic_secret[0x28] & 2) == 0) {
    psVar8 = (properties->field_0).client.max_early_data_size;
    pVar29 = PTLS_EARLY_DATA_REJECTED;
    if (psVar8 != (size_t *)0x0) {
      *psVar8 = 0;
    }
  }
  (properties->field_0).client.early_data_acceptance = pVar29;
  iVar22 = iVar15;
  if ((tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) &&
     (((properties->field_0).server.selected_psk_binder.base[0x2c] & 1) == 0)) {
LAB_0010a92e:
    tls->key_share = *tls->ctx->key_exchanges;
    iVar22 = iVar15;
  }
  goto LAB_0010a941;
LAB_0010b42e:
  if (local_150 == (properties->field_0).client.negotiated_protocols.count) goto LAB_0010b4a1;
  iVar15 = ptls_buffer__do_pushv(buf_00,"",1);
  if (iVar15 != 0) goto LAB_0010aaea;
  sVar21 = buf_00->off;
  ppVar11 = (properties->field_0).client.negotiated_protocols.list;
  iVar15 = ptls_buffer__do_pushv
                     (buf_00,*(void **)((long)ppVar11 + local_158 + -8),
                      *(size_t *)((long)&ppVar11->base + local_158));
  if (iVar15 != 0) goto LAB_0010aaea;
  buf_00->base[sVar21 - 1] = (char)(int)buf_00->off - (char)sVar21;
  local_150 = local_150 + 1;
  local_158 = local_158 + 0x10;
  goto LAB_0010b42e;
LAB_0010b4a1:
  lVar26 = buf_00->off - (long)local_d0;
  local_d0[(long)(buf_00->base + -2)] = (char)((ulong)lVar26 >> 8);
  local_d0[(long)(buf_00->base + -1)] = (char)lVar26;
  lVar26 = buf_00->off - (long)local_108;
  local_108->nonce[(long)(buf_00->base + -0x12)] = (uint8_t)((ulong)lVar26 >> 8);
  local_108->nonce[(long)(buf_00->base + -0x11)] = (uint8_t)lVar26;
LAB_0010b4de:
  if (tls->ctx->decompress_certificate != (ptls_decompress_certificate_t *)0x0) {
    local_9c = 0x1b00;
    iVar15 = ptls_buffer__do_pushv(buf_00,&local_9c,2);
    if ((iVar15 != 0) || (iVar15 = ptls_buffer__do_pushv(buf_00,"",2), iVar15 != 0))
    goto LAB_0010aaea;
    sVar21 = buf_00->off;
    iVar15 = ptls_buffer__do_pushv(buf_00,"",1);
    if (iVar15 != 0) goto LAB_0010aaea;
    puVar33 = tls->ctx->decompress_certificate->supported_algorithms;
    uVar14 = *puVar33;
    if (uVar14 == 0xffff) {
      __assert_fail("*algo != UINT16_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                    ,0x796,
                    "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                   );
    }
    sVar24 = buf_00->off;
    while (puVar33 = puVar33 + 1, uVar14 != 0xffff) {
      local_f6 = uVar14 << 8 | uVar14 >> 8;
      iVar15 = ptls_buffer__do_pushv(buf_00,&local_f6,2);
      if (iVar15 != 0) goto LAB_0010aaea;
      uVar14 = *puVar33;
    }
    buf_00->base[sVar24 - 1] = (char)(int)buf_00->off - (char)sVar24;
    lVar26 = buf_00->off - sVar21;
    buf_00->base[sVar21 - 2] = (uint8_t)((ulong)lVar26 >> 8);
    buf_00->base[sVar21 - 1] = (uint8_t)lVar26;
  }
  local_9e = 0x2b00;
  iVar15 = ptls_buffer__do_pushv(buf_00,&local_9e,2);
  if ((iVar15 == 0) && (iVar15 = ptls_buffer__do_pushv(buf_00,"",2), iVar15 == 0)) {
    sVar21 = buf_00->off;
    iVar15 = ptls_buffer__do_pushv(buf_00,"",1);
    if (iVar15 == 0) {
      sVar24 = buf_00->off;
      lVar26 = 0;
      do {
        if (lVar26 == 8) {
          buf_00->base[sVar24 - 1] = (char)(int)buf_00->off - (char)sVar24;
          lVar26 = buf_00->off - sVar21;
          buf_00->base[sVar21 - 2] = (uint8_t)((ulong)lVar26 >> 8);
          buf_00->base[sVar21 - 1] = (uint8_t)lVar26;
          local_a0 = 0xd00;
          iVar15 = ptls_buffer__do_pushv(buf_00,&local_a0,2);
          if ((iVar15 == 0) && (iVar15 = ptls_buffer__do_pushv(buf_00,"",2), iVar15 == 0)) {
            sVar21 = buf_00->off;
            iVar15 = push_signature_algorithms(buf_00);
            if (iVar15 == 0) {
              lVar26 = buf_00->off - sVar21;
              buf_00->base[sVar21 - 2] = (uint8_t)((ulong)lVar26 >> 8);
              buf_00->base[sVar21 - 1] = (uint8_t)lVar26;
              local_a2 = 0xa00;
              iVar15 = ptls_buffer__do_pushv(buf_00,&local_a2,2);
              if ((iVar15 == 0) && (iVar15 = ptls_buffer__do_pushv(buf_00,"",2), iVar15 == 0)) {
                sVar21 = buf_00->off;
                pppVar23 = tls->ctx->key_exchanges;
                iVar15 = ptls_buffer__do_pushv(buf_00,"",2);
                if (iVar15 == 0) {
                  sVar24 = buf_00->off;
                  goto LAB_0010b778;
                }
              }
            }
          }
          break;
        }
        local_f8 = *(ushort *)((long)supported_versions + lVar26) << 8 |
                   *(ushort *)((long)supported_versions + lVar26) >> 8;
        iVar15 = ptls_buffer__do_pushv(buf_00,&local_f8,2);
        lVar26 = lVar26 + 2;
      } while (iVar15 == 0);
    }
  }
  goto LAB_0010aaea;
  while( true ) {
    uVar14 = (*pppVar23)->id;
    local_fa = uVar14 << 8 | uVar14 >> 8;
    iVar15 = ptls_buffer__do_pushv(buf_00,&local_fa,2);
    pppVar23 = pppVar23 + 1;
    if (iVar15 != 0) break;
LAB_0010b778:
    if (*pppVar23 == (ptls_key_exchange_algorithm_t *)0x0) {
      lVar26 = buf_00->off - sVar24;
      buf_00->base[sVar24 - 2] = (uint8_t)((ulong)lVar26 >> 8);
      buf_00->base[sVar24 - 1] = (uint8_t)lVar26;
      lVar26 = buf_00->off - sVar21;
      buf_00->base[sVar21 - 2] = (uint8_t)((ulong)lVar26 >> 8);
      buf_00->base[sVar21 - 1] = (uint8_t)lVar26;
      if ((cookie != (ptls_iovec_t *)0x0) && (cookie->base != (uint8_t *)0x0)) {
        local_a4 = 0x2c00;
        iVar15 = ptls_buffer__do_pushv(buf_00,&local_a4,2);
        if ((iVar15 != 0) || (iVar15 = ptls_buffer__do_pushv(buf_00,"",2), iVar15 != 0)) break;
        sVar21 = buf_00->off;
        iVar15 = ptls_buffer__do_pushv(buf_00,"",2);
        if (iVar15 != 0) break;
        sVar24 = buf_00->off;
        iVar15 = ptls_buffer__do_pushv(buf_00,cookie->base,cookie->len);
        if (iVar15 != 0) break;
        lVar26 = buf_00->off - sVar24;
        buf_00->base[sVar24 - 2] = (uint8_t)((ulong)lVar26 >> 8);
        buf_00->base[sVar24 - 1] = (uint8_t)lVar26;
        lVar26 = buf_00->off - sVar21;
        buf_00->base[sVar21 - 2] = (uint8_t)((ulong)lVar26 >> 8);
        buf_00->base[sVar21 - 1] = (uint8_t)lVar26;
      }
      iVar15 = push_additional_extensions(properties,buf_00);
      if (iVar15 != 0) break;
      if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0 && local_138 == (ushort *)0x0)
      goto LAB_0010bb89;
      local_a6 = 0x2d00;
      iVar15 = ptls_buffer__do_pushv(buf_00,&local_a6,2);
      if ((iVar15 != 0) || (iVar15 = ptls_buffer__do_pushv(buf_00,"",2), iVar15 != 0)) break;
      sVar21 = buf_00->off;
      iVar15 = ptls_buffer__do_pushv(buf_00,"",1);
      if (iVar15 != 0) break;
      sVar24 = buf_00->off;
      if ((tls->ctx->field_0x68 & 1) == 0) {
        local_fb = 0;
        iVar15 = ptls_buffer__do_pushv(buf_00,&local_fb,1);
        if (iVar15 != 0) break;
      }
      local_fc = 1;
      iVar15 = ptls_buffer__do_pushv(buf_00,&local_fc,1);
      if (iVar15 == 0) {
        buf_00->base[sVar24 - 1] = (char)(int)buf_00->off - (char)sVar24;
        lVar26 = buf_00->off - sVar21;
        buf_00->base[sVar21 - 2] = (uint8_t)((ulong)lVar26 >> 8);
        buf_00->base[sVar21 - 1] = (uint8_t)lVar26;
        if (local_138 == (ushort *)0x0) goto LAB_0010bb89;
        if (((tls->field_20).server.pending_traffic_secret[0x28] & 2) == 0 ||
            ppVar4 != (ptls_key_schedule_t *)0x0) goto LAB_0010b9c0;
        local_a8 = 0x2a00;
        iVar15 = ptls_buffer__do_pushv(buf_00,&local_a8,2);
        if ((iVar15 == 0) && (iVar15 = ptls_buffer__do_pushv(buf_00,"",2), iVar15 == 0)) {
          sVar21 = buf_00->off;
          for (lVar26 = -2; lVar26 != 0; lVar26 = lVar26 + 1) {
            buf_00->base[lVar26 + sVar21] = '\0';
          }
LAB_0010b9c0:
          local_aa = 0x2900;
          iVar15 = ptls_buffer__do_pushv(buf_00,&local_aa,2);
          if ((iVar15 == 0) && (iVar15 = ptls_buffer__do_pushv(buf_00,"",2), iVar15 == 0)) {
            sVar21 = buf_00->off;
            iVar15 = ptls_buffer__do_pushv(buf_00,"",2);
            if (iVar15 != 0) break;
            sVar24 = buf_00->off;
            iVar15 = ptls_buffer__do_pushv(buf_00,"",2);
            if (iVar15 == 0) {
              sVar20 = buf_00->off;
              iVar15 = ptls_buffer__do_pushv(buf_00,resumption_ticket.base,resumption_ticket.len);
              if (iVar15 == 0) {
                lVar26 = buf_00->off - sVar20;
                buf_00->base[sVar20 - 2] = (uint8_t)((ulong)lVar26 >> 8);
                buf_00->base[sVar20 - 1] = (uint8_t)lVar26;
                local_ae = (undefined1)((uint)iVar22 >> 0x18);
                local_ad = (undefined1)((uint)iVar22 >> 0x10);
                local_ac = (undefined1)((uint)iVar22 >> 8);
                local_ab = (undefined1)iVar22;
                iVar15 = ptls_buffer__do_pushv(buf_00,&local_ae,4);
                if (iVar15 == 0) {
                  lVar26 = buf_00->off - sVar24;
                  buf_00->base[sVar24 - 2] = (uint8_t)((ulong)lVar26 >> 8);
                  buf_00->base[sVar24 - 1] = (uint8_t)lVar26;
                  iVar15 = ptls_buffer__do_pushv(buf_00,"",2);
                  if (iVar15 == 0) {
                    sVar24 = buf_00->off;
                    iVar15 = ptls_buffer__do_pushv(buf_00,"",1);
                    if (iVar15 == 0) {
                      sVar20 = buf_00->off;
                      iVar15 = ptls_buffer_reserve(buf_00,(tls->key_schedule->hashes[0].algo)->
                                                          digest_size);
                      if (iVar15 == 0) {
                        sVar25 = buf_00->off + (tls->key_schedule->hashes[0].algo)->digest_size;
                        buf_00->off = sVar25;
                        buf_00->base[sVar20 - 1] = (char)sVar25 - (char)sVar20;
                        lVar26 = buf_00->off - sVar24;
                        buf_00->base[sVar24 - 2] = (uint8_t)((ulong)lVar26 >> 8);
                        buf_00->base[sVar24 - 1] = (uint8_t)lVar26;
                        lVar26 = buf_00->off - sVar21;
                        buf_00->base[sVar21 - 2] = (uint8_t)((ulong)lVar26 >> 8);
                        buf_00->base[sVar21 - 1] = (uint8_t)lVar26;
LAB_0010bb89:
                        lVar26 = buf_00->off - local_c8;
                        buf_00->base[local_c8 - 2] = (uint8_t)((ulong)lVar26 >> 8);
                        buf_00->base[local_c8 - 1] = (uint8_t)lVar26;
                        uVar32 = local_e0->off - local_140;
                        for (; local_f0 != (ptls_key_exchange_algorithm_t **)0xfffffffffffffff8;
                            local_f0 = local_f0 + -1) {
                          local_e0->base[local_140 - 3] =
                               (uint8_t)(uVar32 >> ((byte)local_f0 & 0x3f));
                          local_140 = local_140 + 1;
                        }
                        iVar15 = (*emitter->commit_message)(emitter);
                        if (iVar15 == 0) {
                          if (local_138 != (ushort *)0x0) {
                            sVar21 = emitter->buf->off;
                            ppVar12 = tls->key_schedule->hashes[0].algo;
                            sVar24 = ppVar12->digest_size;
                            iVar15 = derive_secret_with_hash
                                               (tls->key_schedule,binder_key,"res binder",
                                                ppVar12->empty_digest);
                            if (iVar15 != 0) break;
                            paVar34 = (anon_union_104_1_5036e509_for_st_ptls_esni_secret_t_3 *)
                                      ((sVar21 - sVar24) + -3);
                            ptls__key_schedule_update_hash
                                      (tls->key_schedule,
                                       (uint8_t *)((long)local_e8 + (long)emitter->buf->base),
                                       (long)paVar34 - (long)local_e8);
                            iVar15 = calc_verify_data((uint8_t *)
                                                      ((long)paVar34 +
                                                      (long)(emitter->buf->base + 3)),
                                                      tls->key_schedule,binder_key);
                            local_e8 = paVar34;
                            if (iVar15 != 0) break;
                          }
                          ptls__key_schedule_update_hash
                                    (tls->key_schedule,emitter->buf->base + (long)local_e8,
                                     emitter->buf->off - (long)local_e8);
                          if (((tls->field_20).server.pending_traffic_secret[0x28] & 2) != 0) {
                            if (ppVar4 != (ptls_key_schedule_t *)0x0) {
                              __assert_fail("!is_second_flight",
                                            "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                                            ,0x7e2,
                                            "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                                           );
                            }
                            iVar15 = setup_traffic_protection(tls,1,"c e traffic",1,0);
                            if ((iVar15 != 0) ||
                               (iVar15 = push_change_cipher_spec(tls,emitter->buf), iVar15 != 0))
                            break;
                          }
                          if ((ppVar4 != (ptls_key_schedule_t *)0x0 || local_138 == (ushort *)0x0)
                             || (iVar15 = derive_exporter_secret(tls,1), iVar15 == 0)) {
                            tls->state = PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO -
                                         (cookie == (ptls_iovec_t *)0x0);
                            iVar15 = 0x202;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    }
  }
  goto LAB_0010aaea;
}

Assistant:

static int send_client_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_handshake_properties_t *properties,
                             ptls_iovec_t *cookie)
{
    ptls_iovec_t resumption_secret = {NULL}, resumption_ticket;
    uint32_t obfuscated_ticket_age = 0;
    size_t msghash_off;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    int ret, is_second_flight = tls->key_schedule != NULL,
             send_sni = tls->server_name != NULL && !ptls_server_name_is_ipaddr(tls->server_name);

    if (properties != NULL) {
        /* try to use ESNI */
        if (!is_second_flight && send_sni && properties->client.esni_keys.base != NULL) {
            if ((ret = client_setup_esni(tls->ctx, &tls->esni, properties->client.esni_keys, tls->client_random)) != 0)
                goto Exit;
            if (tls->ctx->update_esni_key != NULL) {
                if ((ret = tls->ctx->update_esni_key->cb(tls->ctx->update_esni_key, tls, tls->esni->secret,
                                                         tls->esni->client.cipher->hash, tls->esni->esni_contents_hash)) != 0)
                    goto Exit;
            }
        }
        /* setup resumption-related data. If successful, resumption_secret becomes a non-zero value. */
        if (properties->client.session_ticket.base != NULL) {
            ptls_key_exchange_algorithm_t *key_share = NULL;
            ptls_cipher_suite_t *cipher_suite = NULL;
            uint32_t max_early_data_size;
            if (decode_stored_session_ticket(tls, &key_share, &cipher_suite, &resumption_secret, &obfuscated_ticket_age,
                                             &resumption_ticket, &max_early_data_size, properties->client.session_ticket.base,
                                             properties->client.session_ticket.base + properties->client.session_ticket.len) == 0) {
                tls->client.offered_psk = 1;
                /* key-share selected by HRR should not be overridden */
                if (tls->key_share == NULL)
                    tls->key_share = key_share;
                tls->cipher_suite = cipher_suite;
                if (!is_second_flight && max_early_data_size != 0 && properties->client.max_early_data_size != NULL) {
                    tls->client.using_early_data = 1;
                    *properties->client.max_early_data_size = max_early_data_size;
                }
            } else {
                resumption_secret = ptls_iovec_init(NULL, 0);
            }
        }
        if (tls->client.using_early_data) {
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
        } else {
            if (properties->client.max_early_data_size != NULL)
                *properties->client.max_early_data_size = 0;
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_REJECTED;
        }
    }

    /* use the default key share if still not undetermined */
    if (tls->key_share == NULL && !(properties != NULL && properties->client.negotiate_before_key_exchange))
        tls->key_share = tls->ctx->key_exchanges[0];

    if (!is_second_flight) {
        tls->key_schedule = key_schedule_new(tls->cipher_suite, tls->ctx->cipher_suites, tls->ctx->hkdf_label_prefix__obsolete);
        if ((ret = key_schedule_extract(tls->key_schedule, resumption_secret)) != 0)
            goto Exit;
    }

    msghash_off = emitter->buf->off + emitter->record_header_length;
    ptls_push_message(emitter, NULL, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, {
        ptls_buffer_t *sendbuf = emitter->buf;
        /* legacy_version */
        ptls_buffer_push16(sendbuf, 0x0303);
        /* random_bytes */
        ptls_buffer_pushv(sendbuf, tls->client_random, sizeof(tls->client_random));
        /* lecagy_session_id */
        ptls_buffer_push_block(
            sendbuf, 1, { ptls_buffer_pushv(sendbuf, tls->client.legacy_session_id, sizeof(tls->client.legacy_session_id)); });
        /* cipher_suites */
        ptls_buffer_push_block(sendbuf, 2, {
            ptls_cipher_suite_t **cs = tls->ctx->cipher_suites;
            for (; *cs != NULL; ++cs)
                ptls_buffer_push16(sendbuf, (*cs)->id);
        });
        /* legacy_compression_methods */
        ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, 0); });
        /* extensions */
        ptls_buffer_push_block(sendbuf, 2, {
            struct {
                size_t off;
                size_t len;
            } key_share_client_hello;
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE, {
                key_share_client_hello.off = sendbuf->off;
                ptls_buffer_push_block(sendbuf, 2, {
                    if (tls->key_share != NULL) {
                        if ((ret = tls->key_share->create(tls->key_share, &tls->client.key_share_ctx)) != 0)
                            goto Exit;
                        if ((ret = push_key_share_entry(sendbuf, tls->key_share->id, tls->client.key_share_ctx->pubkey)) != 0)
                            goto Exit;
                    }
                });
                key_share_client_hello.len = sendbuf->off - key_share_client_hello.off;
            });
            if (send_sni) {
                if (tls->esni != NULL) {
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_SERVER_NAME, {
                        if ((ret = emit_esni_extension(tls->esni, sendbuf, properties->client.esni_keys, tls->server_name,
                                                       key_share_client_hello.off, key_share_client_hello.len)) != 0)
                            goto Exit;
                    });
                } else {
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                        if ((ret = emit_server_name_extension(sendbuf, tls->server_name)) != 0)
                            goto Exit;
                    });
                }
            }
            if (properties != NULL && properties->client.negotiated_protocols.count != 0) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ALPN, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        size_t i;
                        for (i = 0; i != properties->client.negotiated_protocols.count; ++i) {
                            ptls_buffer_push_block(sendbuf, 1, {
                                ptls_iovec_t p = properties->client.negotiated_protocols.list[i];
                                ptls_buffer_pushv(sendbuf, p.base, p.len);
                            });
                        }
                    });
                });
            }
            if (tls->ctx->decompress_certificate != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        const uint16_t *algo = tls->ctx->decompress_certificate->supported_algorithms;
                        assert(*algo != UINT16_MAX);
                        for (; *algo != UINT16_MAX; ++algo)
                            ptls_buffer_push16(sendbuf, *algo);
                    });
                });
            }
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS, {
                ptls_buffer_push_block(sendbuf, 1, {
                    size_t i;
                    for (i = 0; i != sizeof(supported_versions) / sizeof(supported_versions[0]); ++i)
                        ptls_buffer_push16(sendbuf, supported_versions[i]);
                });
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS, {
                if ((ret = push_signature_algorithms(sendbuf)) != 0)
                    goto Exit;
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS, {
                ptls_key_exchange_algorithm_t **algo = tls->ctx->key_exchanges;
                ptls_buffer_push_block(sendbuf, 2, {
                    for (; *algo != NULL; ++algo)
                        ptls_buffer_push16(sendbuf, (*algo)->id);
                });
            });
            if (cookie != NULL && cookie->base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COOKIE, {
                    ptls_buffer_push_block(sendbuf, 2, { ptls_buffer_pushv(sendbuf, cookie->base, cookie->len); });
                });
            }
            if ((ret = push_additional_extensions(properties, sendbuf)) != 0)
                goto Exit;
            if (tls->ctx->save_ticket != NULL || resumption_secret.base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        if (!tls->ctx->require_dhe_on_psk)
                            ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK);
                        ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK_DHE);
                    });
                });
            }
            if (resumption_secret.base != NULL) {
                if (tls->client.using_early_data && !is_second_flight)
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_EARLY_DATA, {});
                /* pre-shared key "MUST be the last extension in the ClientHello" (draft-17 section 4.2.6) */
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PRE_SHARED_KEY, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 2,
                                               { ptls_buffer_pushv(sendbuf, resumption_ticket.base, resumption_ticket.len); });
                        ptls_buffer_push32(sendbuf, obfuscated_ticket_age);
                    });
                    /* allocate space for PSK binder. the space is filled at the bottom of the function */
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 1, {
                            if ((ret = ptls_buffer_reserve(sendbuf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
                                goto Exit;
                            sendbuf->off += tls->key_schedule->hashes[0].algo->digest_size;
                        });
                    });
                });
            }
        });
    });

    /* update the message hash, filling in the PSK binder HMAC if necessary */
    if (resumption_secret.base != NULL) {
        size_t psk_binder_off = emitter->buf->off - (3 + tls->key_schedule->hashes[0].algo->digest_size);
        if ((ret = derive_secret_with_empty_digest(tls->key_schedule, binder_key, "res binder")) != 0)
            goto Exit;
        ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, psk_binder_off - msghash_off);
        msghash_off = psk_binder_off;
        if ((ret = calc_verify_data(emitter->buf->base + psk_binder_off + 3, tls->key_schedule, binder_key)) != 0)
            goto Exit;
    }
    ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, emitter->buf->off - msghash_off);

    if (tls->client.using_early_data) {
        assert(!is_second_flight);
        if ((ret = setup_traffic_protection(tls, 1, "c e traffic", 1, 0)) != 0)
            goto Exit;
        if ((ret = push_change_cipher_spec(tls, emitter->buf)) != 0)
            goto Exit;
    }
    if (resumption_secret.base != NULL && !is_second_flight) {
        if ((ret = derive_exporter_secret(tls, 1)) != 0)
            goto Exit;
    }
    tls->state = cookie == NULL ? PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO : PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}